

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O0

void __thiscall OpenMD::RestraintStamp::validate(RestraintStamp *this)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RDI;
  double dVar5;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa08;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_fffffffffffffa10;
  undefined6 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa46;
  undefined1 in_stack_fffffffffffffa47;
  string *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_fffffffffffffa98;
  undefined6 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa6;
  undefined1 in_stack_fffffffffffffaa7;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_fffffffffffffaa8;
  string local_4f8 [32];
  NonNegativeConstraint local_4d8 [2];
  string local_498 [32];
  NonNegativeConstraint local_478 [2];
  string local_438 [32];
  string local_418 [24];
  DataHolder *in_stack_fffffffffffffc00;
  string local_3d8 [32];
  NonNegativeConstraint local_3b8 [2];
  string local_378 [32];
  NonNegativeConstraint local_358;
  allocator<char> local_331;
  string local_330 [103];
  allocator<char> local_2c9;
  string local_2c8 [256];
  string local_1c8 [32];
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [119];
  allocator<char> local_109;
  string local_108 [264];
  
  DataHolder::validate(in_stack_fffffffffffffc00);
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffa47,
                        CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
    isEqualIgnoreCase(in_stack_fffffffffffffa48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffa47,
                        CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
    isEqualIgnoreCase(in_stack_fffffffffffffa48);
    OpenMD::operator||(in_stack_fffffffffffffaa8,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                       CONCAT17(in_stack_fffffffffffffaa7,
                                CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_fffffffffffffa08);
    bVar1 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    std::__cxx11::string::~string(local_1a8);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint(in_stack_fffffffffffffa10);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_fffffffffffffa10);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator(&local_181);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
              ((EqualIgnoreCaseConstraint *)in_stack_fffffffffffffa10);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      uVar3 = std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffa47,
                          CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
      isEqualIgnoreCase(in_stack_fffffffffffffa48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffa47,
                          CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
      isEqualIgnoreCase(in_stack_fffffffffffffa48);
      OpenMD::operator||(in_stack_fffffffffffffaa8,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                         CONCAT17(in_stack_fffffffffffffaa7,
                                  CONCAT16(in_stack_fffffffffffffaa6,in_stack_fffffffffffffaa0)));
      ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>>
      ::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                  *)in_stack_fffffffffffffa08);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar3,uVar4);
      std::__cxx11::string::~string(local_1c8);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint(in_stack_fffffffffffffa10);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_fffffffffffffa10);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator(&local_331);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)in_stack_fffffffffffffa10);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x138));
  if (!bVar1) {
    isNonNegative();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x138));
    bVar1 = NonNegativeConstraint::operator()(&local_358,dVar5);
    bVar2 = bVar1 ^ 0xff;
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2ce99e);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x138));
      uVar3 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_fffffffffffffa08);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar3,uVar4);
      std::__cxx11::string::~string(local_378);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2cea4a);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x170));
  if (!bVar1) {
    isNonNegative();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x170));
    bVar1 = NonNegativeConstraint::operator()(local_3b8,dVar5);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2ceb3c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x170));
      uVar3 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_fffffffffffffa08);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar3,uVar4);
      std::__cxx11::string::~string(local_3d8);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2cebd9);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1a8));
  if (!bVar1) {
    isNonNegative();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x1a8));
    bVar1 = NonNegativeConstraint::operator()((NonNegativeConstraint *)(local_438 + 0x20),dVar5);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2cecc5);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1a8));
      uVar3 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_fffffffffffffa08);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar3,uVar4);
      std::__cxx11::string::~string(local_438);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2ced62);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x1e0));
  if (!bVar1) {
    isNonNegative();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x1e0));
    bVar1 = NonNegativeConstraint::operator()(local_478,dVar5);
    bVar2 = bVar1 ^ 0xff;
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2cee4e);
    if ((bVar2 & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x1e0));
      uVar3 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_fffffffffffffa08);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar3,uVar4);
      std::__cxx11::string::~string(local_498);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2ceeeb);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x218));
  if (!bVar1) {
    isNonNegative();
    dVar5 = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x218));
    bVar1 = NonNegativeConstraint::operator()(local_4d8,dVar5);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2cefd7);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x218));
      uVar3 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)in_stack_fffffffffffffa08);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar3,uVar4);
      std::__cxx11::string::~string(local_4f8);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x2cf074);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void RestraintStamp::validate() {
    DataHolder::validate();
    CheckParameter(
        Type, isEqualIgnoreCase("Object") || isEqualIgnoreCase("Molecular"));
    CheckParameter(DisplacementSpringConstant, isNonNegative());
    CheckParameter(AbsoluteSpringConstant, isNonNegative());
    CheckParameter(TwistSpringConstant, isNonNegative());
    CheckParameter(SwingXSpringConstant, isNonNegative());
    CheckParameter(SwingYSpringConstant, isNonNegative());
    // CheckParameter(MolIndex, isNonNegative());
  }